

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O3

void Wlc_NtkMarkCone_rec(Wlc_Ntk_t *p,Wlc_Obj_t *pObj,Vec_Int_t *vFlops)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar4;
  long lVar5;
  
  uVar1 = *(ushort *)pObj;
  if (-1 < (char)uVar1) {
    *(ushort *)pObj = uVar1 | 0x80;
    if ((uVar1 & 0x3d) == 1) {
      if ((uVar1 & 3) != 1) {
        Vec_IntPush(vFlops,(pObj->field_10).Fanins[1]);
        return;
      }
    }
    else {
      uVar3 = pObj->nFanins;
      if (0 < (int)uVar3) {
        lVar5 = 0;
        do {
          if ((2 < uVar3) || (paVar4 = &pObj->field_10, (*(uint *)pObj & 0x3f | 0x10) == 0x16)) {
            paVar4 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pObj->field_10).pFanins[0];
          }
          uVar2 = paVar4->Fanins[lVar5];
          if ((ulong)uVar2 != 0) {
            if (((int)uVar2 < 1) || (p->nObjsAlloc <= (int)uVar2)) {
              __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                            ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
            }
            Wlc_NtkMarkCone_rec(p,p->pObjs + uVar2,vFlops);
            uVar3 = pObj->nFanins;
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < (int)uVar3);
      }
    }
  }
  return;
}

Assistant:

void Wlc_NtkMarkCone_rec( Wlc_Ntk_t * p, Wlc_Obj_t * pObj, Vec_Int_t * vFlops )
{
    int i, iFanin;
    if ( pObj->Mark )
        return;
    pObj->Mark = 1;
    if ( Wlc_ObjIsCi(pObj) )
    {
        if ( !Wlc_ObjIsPi(pObj) )
            Vec_IntPush( vFlops, Wlc_ObjCiId(pObj) );
        return;
    }
    Wlc_ObjForEachFanin( pObj, iFanin, i ) if ( iFanin )
        Wlc_NtkMarkCone_rec( p, Wlc_NtkObj(p, iFanin), vFlops );
}